

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteTypeObject(BinaryWriterSpec *this,Type type)

{
  char *pcVar1;
  Type local_14;
  
  Stream::Writef(this->json_stream_,"{");
  Stream::Writef(this->json_stream_,"\"%s\": ","type");
  pcVar1 = Type::GetName(&local_14);
  Stream::Writef(this->json_stream_,"\"%s\"",pcVar1);
  Stream::Writef(this->json_stream_,"}");
  return;
}

Assistant:

void BinaryWriterSpec::WriteTypeObject(Type type) {
  json_stream_->Writef("{");
  WriteKey("type");
  WriteString(type.GetName());
  json_stream_->Writef("}");
}